

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

MPP_RET vdpp2_start(vdpp2_api_ctx *ctx)

{
  vdpp2_reg *__s;
  uint uVar1;
  vdpp_addr *pvVar2;
  uint uVar3;
  int iVar4;
  MPP_RET *pMVar5;
  char *pcVar6;
  MPP_RET MVar7;
  RegOffsetInfo reg_off [2];
  MppReqV1 mpp_req [12];
  undefined8 in_stack_fffffffffffffe88;
  undefined4 uVar8;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  zme_reg *local_148;
  undefined8 local_140;
  undefined8 uStack_138;
  anon_struct_272_68_edb8561e_for_yrgb_ver_coe *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  anon_struct_272_68_edb8561e_for_cbcr_hor_coe *local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  anon_struct_272_68_edb8561e_for_cbcr_ver_coe *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  anon_struct_72_18_30ce5766_for_common *local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  dmsr_reg *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  anon_struct_20_5_6b8af94c_for_dci *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  anon_struct_128_23_bd790762_for_es *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  anon_struct_688_147_e6768940_for_sharp *local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  vdpp2_reg *local_58;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  vdpp2_reg *local_40;
  
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  if (ctx == (vdpp2_api_ctx *)0x0) {
    _mpp_log_l(2,"vdpp2","found NULL input vdpp2 ctx %p\n","vdpp2_start",0);
    MVar7 = MPP_ERR_NULL_PTR;
  }
  else {
    uVar1 = (ctx->params).working_mode;
    uVar3 = check_cap(&ctx->params);
    if ((uVar1 == 2 && (uVar3 & 1) == 0) || (uVar1 == 3 && uVar3 < 2)) {
      _mpp_log_l(2,"vdpp2","found incompat work mode %d %s, cap %d\n","vdpp2_start",uVar1,
                 working_mode_name[uVar1 & 3],CONCAT44(uVar8,uVar3));
      MVar7 = MPP_NOK;
    }
    else {
      __s = &ctx->reg;
      local_168 = 0;
      uStack_160 = 0;
      MVar7 = MPP_OK;
      memset(&local_158,0,0x120);
      memset(__s,0,0x440);
      vdpp2_params_to_reg(&ctx->params,ctx);
      local_158 = 0x100000200;
      uStack_150 = 0x200000000110;
      local_140 = 0x100000200;
      uStack_138 = 0x220000000110;
      local_130 = &(ctx->zme).yrgb_ver_coe;
      local_128 = 0x100000200;
      uStack_120 = 0x240000000110;
      local_118 = &(ctx->zme).cbcr_hor_coe;
      local_110 = 0x100000200;
      uStack_108 = 0x260000000110;
      local_100 = &(ctx->zme).cbcr_ver_coe;
      local_f8 = 0x100000200;
      uStack_f0 = 0x280000000048;
      local_e8 = &(ctx->zme).common;
      local_e0 = 0x100000200;
      uStack_d8 = 0x8000000054;
      local_d0 = &ctx->dmsr;
      local_c8 = 0x100000200;
      uStack_c0 = 0xe000000014;
      local_b8 = &(ctx->reg).dci;
      local_b0 = 0x100000200;
      uStack_a8 = 0x10000000080;
      local_a0 = &(ctx->reg).es;
      local_98 = 0x100000200;
      uStack_90 = 0x200000002b0;
      local_88 = &(ctx->reg).sharp;
      local_70 = &local_168;
      local_168 = CONCAT44((ctx->params).src.cbcr_offset,0x19);
      pvVar2 = &(ctx->params).dst;
      if ((ctx->params).yuv_out_diff != 0) {
        pvVar2 = &(ctx->params).dst_c;
      }
      uStack_160 = CONCAT44(pvVar2->cbcr_offset,0x1b);
      local_80 = 0x1100000202;
      uStack_78 = 0x10;
      local_68 = 0x100000200;
      uStack_60 = 0x70;
      local_50 = 0x201;
      uStack_4c = 3;
      uStack_48 = 0x70;
      uStack_44 = 0;
      local_148 = &ctx->zme;
      local_58 = __s;
      local_40 = __s;
      iVar4 = ioctl(ctx->fd,0x40047601,&local_158);
      if (iVar4 != 0) {
        pMVar5 = __errno_location();
        MVar7 = *pMVar5;
        pcVar6 = strerror(MVar7);
        _mpp_log_l(2,"vdpp2","ioctl SET_REG failed ret %d errno %d %s\n","vdpp2_start",iVar4,MVar7,
                   pcVar6);
        MVar7 = *pMVar5;
      }
    }
  }
  return MVar7;
}

Assistant:

MPP_RET vdpp2_start(struct vdpp2_api_ctx *ctx)
{
    MPP_RET ret;
    RegOffsetInfo reg_off[2];
    MppReqV1 mpp_req[12];
    RK_U32 req_cnt = 0;
    struct vdpp2_reg *reg = NULL;
    struct zme_reg *zme = NULL;
    RK_S32 ret_cap = VDPP_CAP_UNSUPPORTED;
    RK_S32 work_mode;

    if (NULL == ctx) {
        mpp_err_f("found NULL input vdpp2 ctx %p\n", ctx);
        return MPP_ERR_NULL_PTR;
    }

    work_mode = ctx->params.working_mode;
    ret_cap = check_cap(&ctx->params);
    if ((!(ret_cap & VDPP_CAP_VEP) && (VDPP_WORK_MODE_VEP == work_mode)) ||
        (!(ret_cap & VDPP_CAP_HIST) && (VDPP_WORK_MODE_DCI == work_mode))) {
        mpp_err_f("found incompat work mode %d %s, cap %d\n", work_mode,
                  working_mode_name[work_mode & 3], ret_cap);
        return MPP_NOK;
    }

    reg = &ctx->reg;
    zme = &ctx->zme;

    memset(reg_off, 0, sizeof(reg_off));
    memset(mpp_req, 0, sizeof(mpp_req));
    memset(reg, 0, sizeof(*reg));

    vdpp2_params_to_reg(&ctx->params, ctx);

    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->yrgb_hor_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_YRGB_HOR_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->yrgb_hor_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->yrgb_ver_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_YRGB_VER_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->yrgb_ver_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->cbcr_hor_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_CBCR_HOR_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->cbcr_hor_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->cbcr_ver_coe);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_CBCR_VER_COE;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->cbcr_ver_coe);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(zme->common);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_ZME_COMMON;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&zme->common);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(ctx->dmsr);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_DMSR;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&ctx->dmsr);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->dci);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_DCI;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->dci);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->es);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_ES;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->es);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->sharp);
    mpp_req[req_cnt].offset = VDPP_REG_OFF_SHARP;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->sharp);

    /* set reg offset */
    reg_off[0].reg_idx = 25;
    reg_off[0].offset = ctx->params.src.cbcr_offset;
    reg_off[1].reg_idx = 27;

    if (!ctx->params.yuv_out_diff)
        reg_off[1].offset = ctx->params.dst.cbcr_offset;
    else
        reg_off[1].offset = ctx->params.dst_c.cbcr_offset;
    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_ADDR_OFFSET;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_REG_OFFSET_ALONE;
    mpp_req[req_cnt].size = sizeof(reg_off);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(reg_off);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_WRITE;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->common);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->common);

    req_cnt++;
    mpp_req[req_cnt].cmd = MPP_CMD_SET_REG_READ;
    mpp_req[req_cnt].flag = MPP_FLAGS_MULTI_MSG | MPP_FLAGS_LAST_MSG;
    mpp_req[req_cnt].size =  sizeof(reg->common);
    mpp_req[req_cnt].offset = 0;
    mpp_req[req_cnt].data_ptr = REQ_DATA_PTR(&reg->common);

    ret = (RK_S32)ioctl(ctx->fd, MPP_IOC_CFG_V1, &mpp_req[0]);

    if (ret) {
        mpp_err_f("ioctl SET_REG failed ret %d errno %d %s\n",
                  ret, errno, strerror(errno));
        ret = errno;
    }

    return ret;
}